

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall ncnn::Convolution::create_requantize_op(Convolution *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  size_t sVar2;
  iterator iVar3;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  int iVar6;
  Layer *pLVar7;
  long lVar8;
  long lVar9;
  float scale_out;
  float scale_in;
  ParamDict pd;
  float local_670;
  float local_66c;
  Mat local_668;
  vector<float,std::allocator<float>> *local_620;
  ModelBinFromMatArray local_618;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  Allocator *local_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  ParamDict local_5d0;
  
  if (this->use_int8_requantize == false) {
    create_requantize_op();
    iVar6 = -1;
  }
  else {
    this_00 = &this->requantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (this_00,(long)this->num_output);
    if (0 < this->num_output) {
      local_620 = (vector<float,std::allocator<float>> *)&this->requantize_scales;
      lVar9 = 0;
      do {
        pLVar7 = create_layer(0x3f);
        (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar9] = pLVar7;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar9 * 4);
        local_66c = (float)(~-(uint)(fVar1 == 0.0) &
                           (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
        local_670 = this->top_blob_int8_scale;
        ParamDict::ParamDict(&local_5d0);
        ParamDict::set(&local_5d0,0,local_66c);
        ParamDict::set(&local_5d0,1,local_670);
        ParamDict::set(&local_5d0,2,this->bias_term);
        ParamDict::set(&local_5d0,3,1);
        pLVar7 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        (*pLVar7->_vptr_Layer[2])(pLVar7,&local_5d0);
        sVar2 = (this->bias_data).elemsize;
        local_668.data = (void *)(sVar2 * lVar9 + (long)(this->bias_data).data);
        local_668.packing = (this->bias_data).packing;
        local_668.allocator = (this->bias_data).allocator;
        uStack_608 = (undefined4)sVar2;
        uStack_604 = (undefined4)(sVar2 >> 0x20);
        local_668.cstep = 1;
        local_668.h = 1;
        local_668.c = 1;
        local_668.dims = 1;
        local_668.w = 1;
        local_668.elemsize._4_4_ = uStack_604;
        local_668.elemsize._0_4_ = uStack_608;
        local_668.refcount._4_4_ = 0;
        local_668.refcount._0_4_ = 0;
        uStack_608 = 0;
        uStack_604 = 0;
        uStack_600 = 0;
        local_618.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_618.weights._0_4_ = 0;
        local_618.weights._4_4_ = 0;
        local_5f0 = 0;
        uStack_5e8 = 0;
        local_5e0 = 0;
        pLVar7 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        local_5f8 = local_668.allocator;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_618,&local_668);
        (*pLVar7->_vptr_Layer[3])(pLVar7,&local_618);
        iVar3._M_current =
             (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_620,iVar3,&local_66c);
        }
        else {
          *iVar3._M_current = local_66c;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar3._M_current =
             (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_620,iVar3,&local_670);
        }
        else {
          *iVar3._M_current = local_670;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        piVar4 = (int *)CONCAT44(local_668.refcount._4_4_,local_668.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_668.allocator == (Allocator *)0x0) {
              if (local_668.data != (void *)0x0) {
                free(local_668.data);
              }
            }
            else {
              (**(code **)(*(long *)local_668.allocator + 0x18))();
            }
          }
        }
        local_668.elemsize._0_4_ = 0;
        local_668.elemsize._4_4_ = 0;
        local_668.packing = 0;
        local_668.data = (void *)0x0;
        local_668.refcount._0_4_ = 0;
        local_668.refcount._4_4_ = 0;
        local_668.dims = 0;
        local_668.w = 0;
        local_668.h = 0;
        local_668.c = 0;
        local_668.cstep = 0;
        lVar8 = 0x560;
        do {
          piVar4 = *(int **)((long)&local_5d0.params[0].v.data + lVar8);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar8);
              plVar5 = *(long **)((long)&local_5d0.params[0].v.packing + lVar8);
              if (plVar5 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar8 + 4) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar8 + 4) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar8) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar8) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar8) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar8) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar8) = 0;
          lVar8 = lVar8 + -0x48;
        } while (lVar8 != -0x40);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_output);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Convolution::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(num_output);
    for (int n=0; n<num_output; n++)
    {
        requantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[n] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[n]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(n, 1);

        requantize_ops[n]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}